

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ComputeMinContributionValues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          BGIP_SolverBranchAndBound<JointPolicyPureVector> *this)

{
  element_type *peVar1;
  pointer pdVar2;
  size_type __n;
  ulong uVar3;
  ostream *poVar4;
  Index ja;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double local_50;
  string local_40;
  
  __n = BayesianGameBase::GetNrJointTypes();
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&local_40);
  if ((__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      local_50 = 1.79769313486232e+308;
      uVar5 = 0;
      while( true ) {
        uVar3 = BayesianGameBase::GetNrJointActions();
        if (uVar3 == uVar5) break;
        peVar1 = (this->_m_bgip).px;
        dVar7 = (double)(**(code **)(*(long *)peVar1 + 0x68))(peVar1,uVar6);
        peVar1 = (this->_m_bgip).px;
        dVar8 = (double)(**(code **)(*(long *)peVar1 + 0x80))(peVar1,uVar6,uVar5);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_50;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar8 * dVar7;
        auVar9 = vminsd_avx(auVar10,auVar9);
        local_50 = auVar9._0_8_;
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pdVar2[uVar6] = local_50;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while ((long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 != uVar6);
  }
  if (2 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound Minimum contribution values: ",0x37)
    ;
    PrintTools::SoftPrintVector<double>(&local_40,__return_storage_ptr__);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> ComputeMinContributionValues() const
    {
        std::vector<double> minValues(_m_bgip->GetNrJointTypes());
        for(Index i=0;i!=minValues.size();++i)
        {
            double minValue=DBL_MAX;
            for(Index ja=0;ja!=_m_bgip->GetNrJointActions();++ja)
            {
                double c=GetContribution(i,ja);
                minValue=std::min(c,minValue);
            }
            minValues[i]=minValue;
        }
        
        if(_m_verbosity>2)
            std::cout << "BGIP_SolverBranchAndBound Minimum contribution values: "
                      << SoftPrintVector(minValues)
                      << std::endl;
        return(minValues);
    }